

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_ci
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  bool bVar1;
  bool bVar2;
  uint32_t i;
  ulong uVar3;
  VkPipeline *out_pipeline;
  
  bVar1 = remap_shader_module_handles<VkRayTracingPipelineCreateInfoKHR>(this,info);
  if ((bVar1) &&
     (((info->basePipelineHandle == (VkPipeline)0x0 ||
       (bVar1 = remap_raytracing_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), bVar1)) &&
      (bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout), bVar1)))) {
    if (info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      bVar1 = true;
    }
    else {
      out_pipeline = info->pLibraryInfo->pLibraries;
      uVar3 = 0;
      do {
        bVar1 = info->pLibraryInfo->libraryCount <= uVar3;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = remap_raytracing_pipeline_handle(this,*out_pipeline,out_pipeline);
        uVar3 = uVar3 + 1;
        out_pipeline = out_pipeline + 1;
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_ci(VkRayTracingPipelineCreateInfoKHR *info)
{
	if (!remap_shader_module_handles(info))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_raytracing_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	if (info->pLibraryInfo)
	{
		auto *libraries = const_cast<VkPipeline *>(info->pLibraryInfo->pLibraries);
		for (uint32_t i = 0; i < info->pLibraryInfo->libraryCount; i++)
		{
			if (!remap_raytracing_pipeline_handle(libraries[i], &libraries[i]))
				return false;
		}
	}

	return true;
}